

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateProfiledNewScFloatArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef)

{
  int iVar1;
  AuxArray<double> AVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  AddrOpndKind AVar6;
  uint sourceContextId;
  uint functionId;
  uint32 uVar7;
  uint32 uVar8;
  uint uVar9;
  Opnd *pOVar10;
  AddrOpnd *pAVar11;
  RegOpnd *opnd;
  undefined4 *puVar12;
  size_t sVar13;
  IndirOpnd *src;
  LabelInstr *target;
  LabelInstr *doneLabel;
  uint i;
  uint missingItem;
  uint offsetStart;
  Opnd *srcOpnd;
  AutoReuseOpnd autoReuseDstElementsOpnd;
  RegOpnd *dstElementsOpnd;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  RegOpnd *headOpnd;
  RegOpnd *dstOpnd;
  bool isHeadSegmentZeroed;
  int *piStack_50;
  uint32 size;
  AuxArray<double> *doubles;
  AddrOpnd *elementsOpnd;
  LabelInstr *helperLabel;
  Func *func;
  intptr_t weakFuncRef_local;
  intptr_t arrayInfoAddr_local;
  ArrayCallSiteInfo *arrayInfo_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  func = (Func *)weakFuncRef;
  weakFuncRef_local = arrayInfoAddr;
  arrayInfoAddr_local = (intptr_t)arrayInfo;
  arrayInfo_local = (ArrayCallSiteInfo *)instr;
  instr_local = (Instr *)this;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ArrayLiteralFastPathPhase,sourceContextId,functionId);
  if (((!bVar5) && ((DAT_01ea9ef9 & 1) == 0)) &&
     (bVar5 = Js::ArrayCallSiteInfo::IsNativeFloatArray((ArrayCallSiteInfo *)arrayInfoAddr_local),
     bVar5)) {
    pOVar10 = IR::Instr::GetSrc1((Instr *)arrayInfo_local);
    pAVar11 = IR::Opnd::AsAddrOpnd(pOVar10);
    AVar6 = IR::AddrOpnd::GetAddrOpndKind(pAVar11);
    if (AVar6 == AddrOpndKindDynamicAuxBufferRef) {
      helperLabel = (LabelInstr *)this->m_func;
      elementsOpnd = (AddrOpnd *)IR::LabelInstr::New(Label,(Func *)helperLabel,true);
      GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                (this,(Instr *)arrayInfo_local,(ArrayCallSiteInfo *)arrayInfoAddr_local,
                 weakFuncRef_local,(LabelInstr *)elementsOpnd);
      pOVar10 = IR::Instr::GetSrc1((Instr *)arrayInfo_local);
      doubles = (AuxArray<double> *)IR::Opnd::AsAddrOpnd(pOVar10);
      piStack_50 = (int *)((AddrOpnd *)doubles)->m_metadata;
      dstOpnd._4_4_ = *piStack_50;
      pOVar10 = IR::Instr::GetDst((Instr *)arrayInfo_local);
      opnd = IR::Opnd::AsRegOpnd(pOVar10);
      uVar7 = Js::JavascriptArray::GetOffsetOfArrayFlags();
      uVar8 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
      if ((ulong)uVar7 + 2 != (ulong)uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x10c9,
                           "(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex())"
                           ,
                           "Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex()"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      autoReuseHeadOpnd._16_8_ =
           GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>
                     (this,(Instr *)arrayInfo_local,(uint32 *)((long)&dstOpnd + 4),
                      (ArrayCallSiteInfo *)arrayInfoAddr_local,(bool *)((long)&dstOpnd + 3));
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_80,(Opnd *)autoReuseHeadOpnd._16_8_,(Func *)helperLabel,true
                );
      uVar7 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
      pAVar11 = IR::AddrOpnd::New((intptr_t)func,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func
                                  ,false,(Var)0x0);
      GenerateMemInit(this,opnd,uVar7,&pAVar11->super_Opnd,(Instr *)arrayInfo_local,
                      (bool)(dstOpnd._3_1_ & 1));
      autoReuseDstElementsOpnd._16_8_ = IR::RegOpnd::New(TyUint64,(Func *)helperLabel);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&srcOpnd,(Opnd *)autoReuseDstElementsOpnd._16_8_,
                 (Func *)helperLabel,true);
      AVar2 = doubles[4];
      sVar13 = Js::AuxArray<double>::OffsetOfElements();
      pAVar11 = IR::AddrOpnd::New((long)AVar2 + sVar13,AddrOpndKindDynamicMisc,(Func *)helperLabel,
                                  false,(Var)0x0);
      uVar4 = autoReuseDstElementsOpnd._16_8_;
      src = IR::IndirOpnd::New((RegOpnd *)autoReuseHeadOpnd._16_8_,0x18,TyUint64,(Func *)helperLabel
                               ,false);
      InsertLea((RegOpnd *)uVar4,&src->super_Opnd,(Instr *)arrayInfo_local);
      GenerateMemCopy(this,(Opnd *)autoReuseDstElementsOpnd._16_8_,&pAVar11->super_Opnd,
                      *piStack_50 << 3,(Instr *)arrayInfo_local);
      iVar1 = *piStack_50;
      uVar9 = dstOpnd._4_4_ - *piStack_50;
      for (doneLabel._4_4_ = 0; uVar4 = autoReuseHeadOpnd._16_8_, doneLabel._4_4_ < uVar9;
          doneLabel._4_4_ = doneLabel._4_4_ + 1) {
        pOVar10 = GetMissingItemOpndForAssignment(TyFloat64,this->m_func);
        GenerateMemInit(this,(RegOpnd *)uVar4,iVar1 * 8 + 0x18 + doneLabel._4_4_ * 8,pOVar10,
                        (Instr *)arrayInfo_local,(bool)(dstOpnd._3_1_ & 1));
      }
      target = IR::LabelInstr::New(Label,(Func *)helperLabel,false);
      InsertBranch(Br,target,(Instr *)arrayInfo_local);
      IR::Instr::InsertBefore((Instr *)arrayInfo_local,(Instr *)elementsOpnd);
      IR::Instr::InsertAfter((Instr *)arrayInfo_local,&target->super_Instr);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&srcOpnd);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateProfiledNewScFloatArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef)
{
    if (PHASE_OFF(Js::ArrayLiteralFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return;
    }

    if (!arrayInfo->IsNativeFloatArray())
    {
        return;
    }

    if (instr->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() != IR::AddrOpndKindDynamicAuxBufferRef)
    {
        return;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // If the array info hasn't mark as not int array yet, go to the helper and mark it.
    // It really is just for assert purpose in JavascriptNativeFloatArray::ToVarArray
    GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);

    IR::AddrOpnd * elementsOpnd = instr->GetSrc1()->AsAddrOpnd();
    Js::AuxArray<double> * doubles = (Js::AuxArray<double> *)elementsOpnd->m_metadata;
    uint32 size = doubles->count;

    // Generate code as in JavascriptArray::NewLiteral
    bool isHeadSegmentZeroed;
    IR::RegOpnd * dstOpnd = instr->GetDst()->AsRegOpnd();
    Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
    IR::RegOpnd * headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isHeadSegmentZeroed);
    const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

    GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isHeadSegmentZeroed);

    // Initialize the elements

    IR::RegOpnd * dstElementsOpnd = IR::RegOpnd::New(TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseDstElementsOpnd(dstElementsOpnd, func);
    IR::Opnd * srcOpnd = IR::AddrOpnd::New((intptr_t)elementsOpnd->m_address + Js::AuxArray<double>::OffsetOfElements(), IR::AddrOpndKindDynamicMisc, func);
    InsertLea(dstElementsOpnd, IR::IndirOpnd::New(headOpnd, sizeof(Js::SparseArraySegmentBase), TyMachPtr, func), instr);
    GenerateMemCopy(dstElementsOpnd, srcOpnd, doubles->count * sizeof(double), instr);

    // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
    uint const offsetStart = sizeof(Js::SparseArraySegmentBase) + doubles->count * sizeof(double);
    uint const missingItem = (size - doubles->count);
    for (uint i = 0; i < missingItem; i++)
    {
        GenerateMemInit(headOpnd, offsetStart + i * sizeof(double),
            GetMissingItemOpndForAssignment(TyFloat64, m_func), instr, isHeadSegmentZeroed);
    }
    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}